

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

TPZMultiphysicsCompMesh * __thiscall
TPZHybridizeHDiv::Hybridize
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *multiphysics,bool group_elements,
          double Lagrange_term_multiplier)

{
  TPZVec<TPZCompMesh_*> *pTVar1;
  TPZCompMesh *pTVar2;
  TPZMultiphysicsCompMesh *cmesh_Hybrid;
  undefined7 in_register_00000011;
  
  pTVar1 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  ComputePeriferalMaterialIds(this,pTVar1);
  pTVar1 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  ComputeNState(this,pTVar1);
  pTVar2 = CreateMultiphysicsMesh(this,multiphysics,1.0);
  cmesh_Hybrid = (TPZMultiphysicsCompMesh *)
                 __dynamic_cast(pTVar2,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo,0);
  CreateInterfaceElements(this,cmesh_Hybrid);
  if ((int)CONCAT71(in_register_00000011,group_elements) != 0) {
    GroupandCondenseElements((TPZCompMesh *)cmesh_Hybrid);
  }
  return cmesh_Hybrid;
}

Assistant:

TPZMultiphysicsCompMesh *TPZHybridizeHDiv::Hybridize(TPZMultiphysicsCompMesh *multiphysics, bool group_elements, double Lagrange_term_multiplier)
{
    ComputePeriferalMaterialIds(multiphysics->MeshVector());
    ComputeNState(multiphysics->MeshVector());
//    InsertPeriferalMaterialObjects(multiphysics->MeshVector());
//    HybridizeInternalSides(multiphysics->MeshVector());
    TPZCompMesh *cmesh = CreateMultiphysicsMesh(multiphysics);
    TPZMultiphysicsCompMesh *result = dynamic_cast<TPZMultiphysicsCompMesh *>(cmesh);
    CreateInterfaceElements(result);
    if(group_elements)
    {
      GroupandCondenseElements(result);
    }
    if(!result) DebugStop();
    return result;

}